

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

_Bool mpack_tree_reserve_bytes(mpack_tree_parser_t *parser,size_t bytes)

{
  ulong uVar1;
  _Bool _Var2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  mpack_tree_error_t p_Var6;
  ulong uVar7;
  size_t sVar8;
  mpack_error_t mVar9;
  mpack_tree_t *pmVar10;
  ulong __size;
  
  sVar3 = parser->possible_nodes_left - bytes;
  if (parser->possible_nodes_left < bytes) {
    pmVar10 = parser->tree;
    sVar8 = pmVar10->data_length;
    __size = pmVar10->max_size;
    uVar5 = sVar8 + bytes;
    if (__size < uVar5) {
      if (pmVar10->error == mpack_ok) {
        pmVar10->error = mpack_error_too_big;
        p_Var6 = pmVar10->error_fn;
        if (p_Var6 != (mpack_tree_error_t)0x0) {
          mVar9 = mpack_error_too_big;
LAB_00109558:
          (*p_Var6)(pmVar10,mVar9);
        }
      }
    }
    else {
      if (pmVar10->read_fn != (mpack_tree_read_t)0x0) {
        uVar7 = pmVar10->buffer_capacity;
        if (uVar7 < uVar5) {
          uVar1 = 0x1000;
          if (uVar7 != 0) {
            uVar1 = uVar7;
          }
          do {
            uVar7 = uVar1;
            uVar1 = uVar7 * 2;
          } while (uVar7 < uVar5);
          if (uVar7 < __size) {
            __size = uVar7;
          }
          if (pmVar10->buffer == (char *)0x0) {
            pcVar4 = (char *)malloc(__size);
          }
          else {
            pcVar4 = (char *)realloc(pmVar10->buffer,__size);
          }
          if (pcVar4 == (char *)0x0) {
            pmVar10 = parser->tree;
            if (pmVar10->error == mpack_ok) {
              pmVar10->error = mpack_error_memory;
              p_Var6 = pmVar10->error_fn;
              if (p_Var6 != (mpack_tree_error_t)0x0) {
                mVar9 = mpack_error_memory;
                goto LAB_00109558;
              }
            }
            goto LAB_0010955a;
          }
          pmVar10->data = pcVar4;
          pmVar10->buffer = pcVar4;
          pmVar10->buffer_capacity = __size;
          sVar8 = pmVar10->data_length;
        }
        do {
          sVar3 = (*pmVar10->read_fn)(pmVar10,pmVar10->buffer + sVar8,
                                      pmVar10->buffer_capacity - sVar8);
          if (pmVar10->error != mpack_ok) goto LAB_0010955a;
          if (sVar3 + 1 < 2) {
            pmVar10 = parser->tree;
            if (pmVar10->error != mpack_ok) goto LAB_0010955a;
            pmVar10->error = mpack_error_io;
            p_Var6 = pmVar10->error_fn;
            if (p_Var6 == (mpack_tree_error_t)0x0) goto LAB_0010955a;
            mVar9 = mpack_error_io;
            goto LAB_00109558;
          }
          sVar8 = pmVar10->data_length + sVar3;
          pmVar10->data_length = sVar8;
          uVar5 = sVar3 + parser->possible_nodes_left;
          parser->possible_nodes_left = uVar5;
          sVar3 = uVar5 - bytes;
        } while (uVar5 < bytes);
        goto LAB_00109514;
      }
      if (pmVar10->error == mpack_ok) {
        pmVar10->error = mpack_error_invalid;
        p_Var6 = pmVar10->error_fn;
        if (p_Var6 != (mpack_tree_error_t)0x0) {
          mVar9 = mpack_error_invalid;
          goto LAB_00109558;
        }
      }
    }
LAB_0010955a:
    _Var2 = false;
  }
  else {
LAB_00109514:
    parser->possible_nodes_left = sVar3;
    _Var2 = true;
  }
  return _Var2;
}

Assistant:

MPACK_STATIC_INLINE bool mpack_tree_reserve_bytes(mpack_tree_parser_t* parser, size_t bytes) {
    if (bytes <= parser->possible_nodes_left) {
        parser->possible_nodes_left -= bytes;
        return true;
    }

    #ifdef MPACK_MALLOC
    return mpack_tree_reserve_fill(parser, bytes);
    #else
    mpack_tree_flag_error(parser->tree, mpack_error_invalid);
    return false;
    #endif
}